

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O2

Element * Assimp::FBX::GetRequiredElement(Scope *sc,string *index,Element *element)

{
  Element *pEVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pEVar1 = Scope::operator[](sc,index);
  if (pEVar1 != (Element *)0x0) {
    return pEVar1;
  }
  std::operator+(&local_38,"did not find required element \"",index);
  std::operator+(&bStack_58,&local_38,"\"");
  anon_unknown.dwarf_cefc03::ParseError(&bStack_58,element);
}

Assistant:

const Element& GetRequiredElement(const Scope& sc, const std::string& index, const Element* element /*= NULL*/)
{
    const Element* el = sc[index];
    if(!el) {
        ParseError("did not find required element \"" + index + "\"",element);
    }
    return *el;
}